

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

apx_vm_t * apx_vm_new(void)

{
  apx_error_t aVar1;
  apx_vm_t *self;
  
  self = (apx_vm_t *)malloc(0x170);
  if (self != (apx_vm_t *)0x0) {
    aVar1 = apx_vm_create(self);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_vm_t *)0x0;
}

Assistant:

apx_vm_t* apx_vm_new(void)
{
   apx_vm_t *self = (apx_vm_t*) malloc(sizeof(apx_vm_t));
   if (self != NULL)
   {
      apx_error_t result = apx_vm_create(self);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}